

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this)

{
  ~SimpleTypeData(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}